

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

SettingsValue * __thiscall
node::anon_unknown_2::ChainImpl::getRwSetting(ChainImpl *this,string *name)

{
  long lVar1;
  ArgsManager *in_RSI;
  SettingsValue *in_RDI;
  long in_FS_OFFSET;
  SettingsValue *result;
  UniValue *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue(in_stack_ffffffffffffff88);
  args((ChainImpl *)in_stack_ffffffffffffff88);
  ArgsManager::
  LockSettings<node::(anonymous_namespace)::ChainImpl::getRwSetting(std::__cxx11::string_const&)::_lambda(common::Settings_const&)_1_>
            (in_RSI,(anon_class_16_2_50d0e9cb *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

common::SettingsValue getRwSetting(const std::string& name) override
    {
        common::SettingsValue result;
        args().LockSettings([&](const common::Settings& settings) {
            if (const common::SettingsValue* value = common::FindKey(settings.rw_settings, name)) {
                result = *value;
            }
        });
        return result;
    }